

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

image_u8 * __thiscall image_u8::crop(image_u8 *this,uint32_t new_width,uint32_t new_height)

{
  uint *puVar1;
  color_quad_u8 *pcVar2;
  uint32_t in_EDX;
  uint32_t in_ESI;
  image_u8 *in_RDI;
  uint32_t x;
  uint32_t y;
  uint32_t h;
  uint32_t w;
  image_u8 new_image;
  image_u8 *in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffb8;
  uint uVar3;
  uint32_t in_stack_ffffffffffffffbc;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar6;
  uint local_18;
  uint local_14 [3];
  image_u8 *local_8;
  
  if ((in_RDI->m_width != in_ESI) || (local_8 = in_RDI, in_RDI->m_height != in_EDX)) {
    image_u8((image_u8 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    puVar1 = std::min<unsigned_int>(&in_RDI->m_width,local_14);
    uVar6 = *puVar1;
    puVar1 = std::min<unsigned_int>(&in_RDI->m_height,&local_18);
    uVar5 = *puVar1;
    for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      for (uVar3 = 0; uVar3 < uVar6; uVar3 = uVar3 + 1) {
        in_stack_ffffffffffffffa8 =
             (image_u8 *)
             operator()(in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                        (uint32_t)in_stack_ffffffffffffffa8);
        pcVar2 = operator()(in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                            (uint32_t)in_stack_ffffffffffffffa8);
        *(undefined4 *)pcVar2->m_c =
             *(undefined4 *)
              &(in_stack_ffffffffffffffa8->m_pixels).
               super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
               super__Vector_impl_data._M_start;
      }
    }
    local_8 = swap(in_RDI,in_stack_ffffffffffffffa8);
    ~image_u8((image_u8 *)0x13bbd3);
  }
  return local_8;
}

Assistant:

image_u8& crop(uint32_t new_width, uint32_t new_height)
	{
		if ((m_width == new_width) && (m_height == new_height))
			return *this;

		image_u8 new_image(new_width, new_height);

		const uint32_t w = std::min(m_width, new_width);
		const uint32_t h = std::min(m_height, new_height);

		for (uint32_t y = 0; y < h; y++)
			for (uint32_t x = 0; x < w; x++)
				new_image(x, y) = (*this)(x, y);

		return swap(new_image);
	}